

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

bool __thiscall glcts::LayoutBindingBaseCase::needsPrecision(LayoutBindingBaseCase *this)

{
  bool bVar1;
  ContextType type;
  RenderContext *pRVar2;
  bool local_2a;
  bool local_29;
  LayoutBindingBaseCase *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  if ((bVar1) || (this->m_glslVersion == GLSL_VERSION_450)) {
    local_29 = false;
    if ((this->m_testParams).surface_type != UniformBlock) {
      local_29 = (this->m_testParams).surface_type != ShaderStorageBuffer;
    }
    this_local._7_1_ = local_29;
  }
  else {
    local_2a = false;
    if (((this->m_testParams).surface_type != UniformBlock) &&
       ((local_2a = false, (this->m_testParams).surface_type != ShaderStorageBuffer &&
        (local_2a = false, (this->m_testParams).surface_type != AtomicCounter)))) {
      local_2a = (this->m_testParams).surface_type != Image;
    }
    this_local._7_1_ = local_2a;
  }
  return this_local._7_1_;
}

Assistant:

bool needsPrecision() const
	{
		if (isContextTypeES(m_context.getRenderContext().getType()) || m_glslVersion == glu::GLSL_VERSION_450)
		{
			return (m_testParams.surface_type != UniformBlock) && (m_testParams.surface_type != ShaderStorageBuffer);
		}
		else
		{
			return (m_testParams.surface_type != UniformBlock) && (m_testParams.surface_type != ShaderStorageBuffer) &&
				   (m_testParams.surface_type != AtomicCounter) && (m_testParams.surface_type != Image);
		}
	}